

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O2

bool crnlib::create_compressed_texture
               (crn_comp_params *params,crn_mipmap_params *mipmap_params,
               vector<unsigned_char> *comp_data,uint32 *pActual_quality_level,float *pActual_bitrate
               )

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  image<crnlib::color_quad<unsigned_char,_int>_> *this;
  crn_uint32 **ppcVar5;
  uint uVar6;
  ulong uVar7;
  uint f;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  vector<crnlib::vector<crnlib::mip_level_*>_> *this_00;
  uint level_index;
  crn_uint32 *(*papcVar12) [16];
  ulong uVar13;
  crn_comp_params *this_01;
  crn_comp_params *pcVar14;
  crn_comp_params *local_12d8;
  mip_level *local_12c0;
  face_vec faces;
  mipmapped_texture work_tex;
  crn_comp_params new_params;
  
  vector<unsigned_char>::resize(comp_data,0,false);
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  mipmapped_texture::mipmapped_texture(&work_tex);
  lVar4 = 0x18;
  do {
    *(undefined8 *)((long)(new_params.m_pImages + -1) + 0x40 + lVar4) = 0;
    *(undefined8 *)((long)(new_params.m_pImages + -1) + 0x48 + lVar4) = 0;
    *(undefined4 *)((long)(new_params.m_pImages + -1) + 0x50 + lVar4) = 0xf;
    *(undefined8 *)((long)(new_params.m_pImages + -1) + 0x68 + lVar4) = 0;
    *(undefined8 *)((long)(new_params.m_pImages + -1) + 0x58 + lVar4) = 0;
    *(undefined8 *)((long)(new_params.m_pImages + -1) + 0x60 + lVar4) = 0;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0x1218);
  papcVar12 = params->m_pImages;
  pcVar14 = &new_params;
  uVar10 = 0;
  uVar8 = 0;
  while( true ) {
    uVar3 = params->m_faces;
    uVar7 = (ulong)uVar3;
    if (uVar7 <= uVar10) break;
    this_01 = pcVar14;
    for (uVar11 = 0; uVar11 < params->m_levels; uVar11 = uVar11 + 1) {
      if ((color_quad<unsigned_char,_int> *)(*papcVar12)[uVar11] ==
          (color_quad<unsigned_char,_int> *)0x0) goto LAB_001371b8;
      uVar3 = params->m_height >> ((byte)uVar11 & 0x1f);
      uVar6 = params->m_width >> ((byte)uVar11 & 0x1f);
      image<crnlib::color_quad<unsigned_char,_int>_>::alias
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)this_01,
                 (color_quad<unsigned_char,_int> *)(*papcVar12)[uVar11],uVar6 + (uVar6 == 0),
                 uVar3 + (uVar3 == 0),0xffffffff,0xf);
      if (uVar8 == 0) {
        bVar1 = image_utils::has_alpha((image_u8 *)this_01);
        uVar8 = (uint)bVar1;
      }
      this_01 = (crn_comp_params *)(this_01->m_pImages[0] + 1);
    }
    uVar10 = uVar10 + 1;
    pcVar14 = (crn_comp_params *)(pcVar14->m_pImages[5] + 0xb);
    papcVar12 = papcVar12 + 1;
  }
  uVar6 = params->m_levels;
  ppcVar5 = (crn_uint32 **)&new_params.m_height;
  for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    for (lVar4 = 0; (ulong)uVar6 * 0x30 - lVar4 != 0; lVar4 = lVar4 + 0x30) {
      *(uint *)((long)ppcVar5 + lVar4) = *(uint *)((long)ppcVar5 + lVar4) & 0xfffffff7 | uVar8 << 3;
    }
    ppcVar5 = ppcVar5 + 0x60;
  }
  this_00 = &faces;
  vector<crnlib::vector<crnlib::mip_level_*>_>::vector(this_00,uVar3);
  local_12d8 = &new_params;
  for (uVar11 = 0; uVar11 < params->m_faces; uVar11 = uVar11 + 1) {
    pcVar14 = local_12d8;
    for (uVar13 = 0; uVar13 < params->m_levels; uVar13 = uVar13 + 1) {
      local_12c0 = crnlib_new<crnlib::mip_level>();
      this = (image<crnlib::color_quad<unsigned_char,_int>_> *)
             crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)this_00);
      image<crnlib::color_quad<unsigned_char,_int>_>::swap
                (this,(image<crnlib::color_quad<unsigned_char,_int>_> *)pcVar14);
      mip_level::assign(local_12c0,this,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
      this_00 = (vector<crnlib::vector<crnlib::mip_level_*>_> *)(faces.m_p + uVar11);
      vector<crnlib::mip_level_*>::push_back((vector<crnlib::mip_level_*> *)this_00,&local_12c0);
      pcVar14 = (crn_comp_params *)(pcVar14->m_pImages[0] + 1);
    }
    local_12d8 = (crn_comp_params *)(local_12d8->m_pImages[5] + 0xb);
  }
  mipmapped_texture::assign(&work_tex,&faces);
  vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&faces);
LAB_001371b8:
  lVar4 = 0x11f0;
  do {
    vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
              ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
               ((long)(new_params.m_pImages + -1) + 0x58 + lVar4));
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != -0x10);
  if (uVar10 < uVar7) {
    bVar2 = false;
    console::error("Failed creating DDS texture from crn_comp_params!");
  }
  else {
    bVar1 = create_texture_mipmaps(&work_tex,params,mipmap_params,true);
    uVar9 = 0;
    bVar2 = false;
    if (bVar1) {
      memcpy(&new_params,params,0x378);
      if ((ulong)work_tex.m_faces.m_size != 0) {
        uVar9 = (work_tex.m_faces.m_p)->m_size;
      }
      papcVar12 = new_params.m_pImages;
      new_params.m_levels = uVar9;
      memset(papcVar12,0,0x300);
      for (uVar10 = 0; uVar10 != work_tex.m_faces.m_size; uVar10 = uVar10 + 1) {
        uVar8 = (work_tex.m_faces.m_p)->m_size;
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          (*papcVar12)[uVar7] =
               (crn_uint32 *)work_tex.m_faces.m_p[uVar10].m_p[uVar7]->m_pImage->m_pPixels;
        }
        papcVar12 = papcVar12 + 1;
      }
      bVar2 = create_compressed_texture(&new_params,comp_data,pActual_quality_level,pActual_bitrate)
      ;
    }
  }
  mipmapped_texture::~mipmapped_texture(&work_tex);
  return bVar2;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, const crn_mipmap_params& mipmap_params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate)
    {
        comp_data.resize(0);
        if (pActual_bitrate)
        {
            *pActual_bitrate = 0.0f;
        }
        if (pActual_quality_level)
        {
            *pActual_quality_level = 0;
        }

        mipmapped_texture work_tex;
        if (!create_dds_tex(params, work_tex))
        {
            console::error("Failed creating DDS texture from crn_comp_params!");
            return false;
        }

        if (!create_texture_mipmaps(work_tex, params, mipmap_params, true))
        {
            return false;
        }

        crn_comp_params new_params(params);
        new_params.m_levels = work_tex.get_num_levels();
        memset(new_params.m_pImages, 0, sizeof(new_params.m_pImages));

        for (uint f = 0; f < work_tex.get_num_faces(); f++)
        {
            for (uint l = 0; l < work_tex.get_num_levels(); l++)
            {
                new_params.m_pImages[f][l] = (uint32*)work_tex.get_level(f, l)->get_image()->get_ptr();
            }
        }

        return create_compressed_texture(new_params, comp_data, pActual_quality_level, pActual_bitrate);
    }